

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O3

Uint64 __thiscall Diligent::FenceVkImpl::InternalGetCompletedValue(FenceVkImpl *this)

{
  atomic<unsigned_long> *paVar1;
  VulkanLogicalDevice *this_00;
  ulong uVar2;
  VkResult VVar3;
  ulong uVar4;
  ulong uVar5;
  char (*in_RCX) [23];
  ulong uVar6;
  SyncPointData *Item;
  _Elt_pointer pSVar7;
  bool bVar8;
  string msg;
  string local_40;
  
  if ((this->m_TimelineSemaphore).m_VkObject != (VkSemaphore_T *)0x0) {
    FormatString<char[26],char[23]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!IsTimelineSemaphore()",in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"InternalGetCompletedValue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0x81);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  pSVar7 = (this->m_SyncPoints).
           super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->m_SyncPoints).
      super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar7) {
    this_00 = (((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
               .m_pDevice)->m_LogicalVkDevice).
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    do {
      VVar3 = VulkanUtilities::VulkanLogicalDevice::GetFenceStatus
                        (this_00,(((pSVar7->SyncPoint).
                                   super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->m_Fence).m_VkSyncObject);
      if (VVar3 != VK_SUCCESS) break;
      uVar2 = pSVar7->Value;
      uVar4 = (this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue.
              super___atomic_base<unsigned_long>._M_i;
      do {
        uVar6 = uVar2;
        if (uVar2 < uVar4) {
          uVar6 = uVar4;
        }
        paVar1 = &(this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue;
        LOCK();
        uVar5 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
        bVar8 = uVar4 == uVar5;
        if (bVar8) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = uVar6;
          uVar5 = uVar4;
        }
        UNLOCK();
        uVar4 = uVar5;
      } while (!bVar8);
      std::
      deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
      ::pop_front(&this->m_SyncPoints);
      pSVar7 = (this->m_SyncPoints).
               super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->m_SyncPoints).
             super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar7);
  }
  return (this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue.
         super___atomic_base<unsigned_long>._M_i;
}

Assistant:

Uint64 FenceVkImpl::InternalGetCompletedValue()
{
    VERIFY_EXPR(!IsTimelineSemaphore());

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
    while (!m_SyncPoints.empty())
    {
        SyncPointData& Item = m_SyncPoints.front();

        VkResult status = LogicalDevice.GetFenceStatus(Item.SyncPoint->GetFence());
        if (status == VK_SUCCESS)
        {
            UpdateLastCompletedFenceValue(Item.Value);
            m_SyncPoints.pop_front();
        }
        else
        {
            break;
        }
    }

    return m_LastCompletedFenceValue.load();
}